

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * GetEnumName_abi_cxx11_(string *__return_storage_ptr__,JSONErrorType err)

{
  code *pcVar1;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  JSONErrorType local_14;
  string *psStack_10;
  JSONErrorType err_local;
  
  local_14 = err;
  psStack_10 = __return_storage_ptr__;
  switch(err) {
  case NAME_ALREADY_EXITS:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NAME_ALREADY_EXITS",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case NAME_NOT_FOUND:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NAME_NOT_FOUND",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case INVALID_JSON_OBJECT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_JSON_OBJECT",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case INVALID_ARRAY:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_ARRAY",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case INVALID_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_TYPE",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case INVALID_CAST:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INVALID_CAST",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case EXPECTED_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EXPECTED_BOOL",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case EXPECTED_NULL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EXPECTED_NULL",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case EXPECTED_NUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EXPECTED_NUM",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case WRONG_PLACED_SEPERATOR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"WRONG_PLACED_SEPERATOR",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case MISSING_KEY:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MISSING_KEY",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case MISSING_VALUE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MISSING_VALUE",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case MISSING_SEPERATOR:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MISSING_SEPERATOR",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return __return_storage_ptr__;
}

Assistant:

string GetEnumName(JSONErrorType err)
{
    switch (err)
    {
        case JSONErrorType::NAME_ALREADY_EXITS: return "NAME_ALREADY_EXITS";
        case JSONErrorType::NAME_NOT_FOUND: return "NAME_NOT_FOUND";
        case JSONErrorType::INVALID_JSON_OBJECT: return "INVALID_JSON_OBJECT";
        case JSONErrorType::INVALID_ARRAY: return "INVALID_ARRAY";
        case JSONErrorType::INVALID_TYPE: return "INVALID_TYPE";
        case JSONErrorType::INVALID_CAST: return "INVALID_CAST";
        case JSONErrorType::EXPECTED_BOOL: return "EXPECTED_BOOL";
        case JSONErrorType::EXPECTED_NULL: return "EXPECTED_NULL";
        case JSONErrorType::EXPECTED_NUM: return "EXPECTED_NUM";
        case JSONErrorType::WRONG_PLACED_SEPERATOR: return "WRONG_PLACED_SEPERATOR";
        case JSONErrorType::MISSING_KEY: return "MISSING_KEY";
        case JSONErrorType::MISSING_VALUE: return "MISSING_VALUE";
        case JSONErrorType::MISSING_SEPERATOR: return "MISSING_SEPERATOR";
    }
}